

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-exceptions.hpp
# Opt level: O2

void __thiscall helics::ConnectionFailure::~ConnectionFailure(ConnectionFailure *this)

{
  HelicsException::~HelicsException(&this->super_HelicsException);
  operator_delete(this,0x28);
  return;
}

Assistant:

explicit ConnectionFailure(std::string_view message = "failed to connect") noexcept:
        HelicsException(message)
    {
    }